

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.cc
# Opt level: O0

void Imageio::catalogBuiltinPlugins(void)

{
  char **in_stack_00000080;
  Creator in_stack_00000088;
  char **in_stack_00000090;
  Creator in_stack_00000098;
  string *in_stack_000000a0;
  allocator<char> local_a9;
  string local_a8 [8];
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_81;
  string local_80 [39];
  allocator<char> local_59;
  string local_58 [55];
  allocator<char> local_21;
  string local_20 [32];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  declareImageioFormat
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  ::std::__cxx11::string::~string(local_20);
  ::std::allocator<char>::~allocator(&local_21);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  declareImageioFormat
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  ::std::__cxx11::string::~string(local_58);
  ::std::allocator<char>::~allocator(&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  declareImageioFormat
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  ::std::__cxx11::string::~string(local_80);
  ::std::allocator<char>::~allocator(&local_81);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  declareImageioFormat
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  ::std::__cxx11::string::~string(local_a8);
  ::std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

void
catalogBuiltinPlugins()
{
#define DECLAREPLUG(name)                                      \
        declareImageioFormat(                                  \
            #name, (ImageInput::Creator)name##InputCreate,     \
            name##InputExtensions,                             \
            (ImageOutput::Creator)name##OutputCreate,          \
            name##OutputExtensions)
#define DECLAREPLUG_RO(name)                                   \
        declareImageioFormat(                                  \
            #name, (ImageInput::Creator)name##InputCreate,     \
            name##InputExtensions,                             \
            nullptr, nullptr)
#define DECLAREPLUG_WO(name)                                   \
        declareImageioFormat(                                  \
            nullptr, nullptr,                                  \
            #name, (ImageOutput::Creator)name##OutputCreate,   \
            name##OutputExtensions)

#if !defined(DISABLE_OPENEXR)
    DECLAREPLUG_RO (exr);
#endif
#if !defined(DISABLE_JPEG)
    DECLAREPLUG_RO(jpeg);
#endif
#if !defined(DISABLE_NPBM)
    DECLAREPLUG_RO (npbm);
#endif
#if !defined(DISABLE_PNG)
    DECLAREPLUG (png);
#endif
    // 'Raw' format is not in the catalog as an explicit API is a better fit
}